

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsubcmesh.cpp
# Opt level: O0

void __thiscall TPZSubCompMesh::SetAnalysisNonSymSparse(TPZSubCompMesh *this,int numThreads)

{
  bool bVar1;
  int iVar2;
  TPZStructMatrix *pTVar3;
  int64_t mineq;
  TPZAnalysis *this_00;
  TPZEquationFilter *strmatrix;
  TPZStepSolver<double> *this_01;
  undefined4 extraout_var;
  TPZStepSolver<double> *obj;
  void *pvVar4;
  TPZLinearAnalysis *this_02;
  TPZMatrixSolver<double> *pTVar5;
  int in_ESI;
  long in_RDI;
  TPZAutoPointer<TPZMatrixSolver<double>_> autostep;
  TPZStepSolver<double> *step;
  TPZAutoPointer<TPZMatrix<double>_> mat;
  int64_t numinternal;
  TPZAutoPointer<TPZStructMatrix> str;
  TPZCompMesh *in_stack_000001c0;
  size_t in_stack_00000328;
  char *in_stack_00000330;
  TPZAutoPointer<TPZStructMatrix> *in_stack_ffffffffffffff08;
  DecomposeType decomp;
  TPZStepSolver<double> *in_stack_ffffffffffffff10;
  TPZCompMesh *in_stack_ffffffffffffff28;
  TPZSpStructMatrix<double,_TPZStructMatrixOR<double>_> *in_stack_ffffffffffffff30;
  TPZSubCompMesh *in_stack_ffffffffffffff40;
  TPZSubCompMesh *in_stack_ffffffffffffff48;
  TPZSubMeshAnalysis *in_stack_ffffffffffffff50;
  TPZAutoPointer local_60 [15];
  undefined1 local_51;
  void *local_48;
  TPZAutoPointer local_38 [8];
  int64_t local_30;
  TPZAutoPointer<TPZStructMatrix> local_28 [3];
  int local_c;
  TPZAutoPointer<TPZMatrix<double>_> *refmat;
  
  local_c = in_ESI;
  operator_new(0x528);
  TPZSubMeshAnalysis::TPZSubMeshAnalysis(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  TPZAutoPointer<TPZLinearAnalysis>::operator=
            ((TPZAutoPointer<TPZLinearAnalysis> *)in_stack_ffffffffffffff30,
             (TPZSubMeshAnalysis *)in_stack_ffffffffffffff28);
  TPZAutoPointer<TPZStructMatrix>::TPZAutoPointer
            ((TPZAutoPointer<TPZStructMatrix> *)in_stack_ffffffffffffff30,
             (TPZStructMatrix *)in_stack_ffffffffffffff28);
  if (local_c < 1) {
    operator_new(0xb8);
    TPZSpStructMatrix<double,_TPZStructMatrixOR<double>_>::TPZStructMatrix
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    TPZAutoPointer<TPZStructMatrix>::operator=
              ((TPZAutoPointer<TPZStructMatrix> *)in_stack_ffffffffffffff30,
               (TPZSpStructMatrix<double,_TPZStructMatrixOR<double>_> *)in_stack_ffffffffffffff28);
  }
  else {
    operator_new(0xb8);
    TPZSpStructMatrix<double,_TPZStructMatrixOR<double>_>::TPZStructMatrix
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    TPZAutoPointer<TPZStructMatrix>::operator=
              ((TPZAutoPointer<TPZStructMatrix> *)in_stack_ffffffffffffff30,
               (TPZSpStructMatrix<double,_TPZStructMatrixOR<double>_> *)in_stack_ffffffffffffff28);
    pTVar3 = TPZAutoPointer<TPZStructMatrix>::operator->(local_28);
    TPZStrMatParInterface::SetNumThreads
              ((TPZStrMatParInterface *)(&pTVar3->field_0x0 + *(long *)(*(long *)pTVar3 + -0x60)),
               local_c);
  }
  TPZCompMesh::SaddlePermute(in_stack_000001c0);
  PermuteExternalConnects(this);
  pTVar3 = TPZAutoPointer<TPZStructMatrix>::operator->(local_28);
  TPZStrMatParInterface::SetNumThreads
            ((TPZStrMatParInterface *)(&pTVar3->field_0x0 + *(long *)(*(long *)pTVar3 + -0x60)),
             local_c);
  mineq = NumInternalEquations(in_stack_ffffffffffffff40);
  local_30 = mineq;
  this_00 = (TPZAnalysis *)TPZAutoPointer<TPZStructMatrix>::operator->(local_28);
  strmatrix = ::TPZStructMatrix::EquationFilter((TPZStructMatrix *)this_00);
  TPZEquationFilter::SetMinMaxEq((TPZEquationFilter *)pTVar3,mineq,(int64_t)this_00);
  this_01 = (TPZStepSolver<double> *)TPZAutoPointer<TPZStructMatrix>::operator->(local_28);
  iVar2 = (*(this_01->super_TPZMatrixSolver<double>).super_TPZSolver.super_TPZSavable.
            _vptr_TPZSavable[10])();
  refmat = (TPZAutoPointer<TPZMatrix<double>_> *)CONCAT44(extraout_var,iVar2);
  if (refmat != (TPZAutoPointer<TPZMatrix<double>_> *)0x0) {
    __dynamic_cast(refmat,&TPZBaseMatrix::typeinfo,&TPZMatrix<double>::typeinfo,0);
  }
  TPZAutoPointer<TPZMatrix<double>_>::TPZAutoPointer
            ((TPZAutoPointer<TPZMatrix<double>_> *)in_stack_ffffffffffffff30,
             (TPZMatrix<double> *)in_stack_ffffffffffffff28);
  bVar1 = ::TPZAutoPointer::operator_cast_to_bool(local_38);
  if (!bVar1) {
    std::operator<<((ostream *)&std::cerr,"void TPZSubCompMesh::SetAnalysisNonSymSparse(int)");
    std::operator<<((ostream *)&std::cerr,"ERROR\n: Incompatible types. Aborting...\n");
    pzinternal::DebugStopImpl(in_stack_00000330,in_stack_00000328);
  }
  pTVar3 = TPZAutoPointer<TPZStructMatrix>::operator->(local_28);
  obj = (TPZStepSolver<double> *)::TPZStructMatrix::EquationFilter(pTVar3);
  TPZEquationFilter::Reset((TPZEquationFilter *)in_stack_ffffffffffffff10);
  TPZAutoPointer<TPZLinearAnalysis>::operator->
            ((TPZAutoPointer<TPZLinearAnalysis> *)(in_RDI + 0x940));
  TPZAutoPointer<TPZStructMatrix>::TPZAutoPointer
            ((TPZAutoPointer<TPZStructMatrix> *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08)
  ;
  TPZAnalysis::SetStructuralMatrix(this_00,(TPZAutoPointer<TPZStructMatrix> *)strmatrix);
  TPZAutoPointer<TPZStructMatrix>::~TPZAutoPointer
            ((TPZAutoPointer<TPZStructMatrix> *)in_stack_ffffffffffffff10);
  pvVar4 = operator_new(0x100);
  local_51 = 1;
  TPZAutoPointer<TPZMatrix<double>_>::TPZAutoPointer
            ((TPZAutoPointer<TPZMatrix<double>_> *)in_stack_ffffffffffffff10,
             (TPZAutoPointer<TPZMatrix<double>_> *)in_stack_ffffffffffffff08);
  decomp = (DecomposeType)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  TPZStepSolver<double>::TPZStepSolver(this_01,refmat);
  local_51 = 0;
  TPZAutoPointer<TPZMatrix<double>_>::~TPZAutoPointer
            ((TPZAutoPointer<TPZMatrix<double>_> *)in_stack_ffffffffffffff10);
  local_48 = pvVar4;
  TPZStepSolver<double>::SetDirect(in_stack_ffffffffffffff10,decomp);
  TPZAutoPointer<TPZMatrixSolver<double>>::TPZAutoPointer<TPZStepSolver<double>>
            ((TPZAutoPointer<TPZMatrixSolver<double>_> *)pTVar3,obj);
  this_02 = TPZAutoPointer<TPZLinearAnalysis>::operator->
                      ((TPZAutoPointer<TPZLinearAnalysis> *)(in_RDI + 0x940));
  pTVar5 = ::TPZAutoPointer::operator_cast_to_TPZMatrixSolver_(local_60);
  (*(this_02->super_TPZAnalysis).super_TPZSavable._vptr_TPZSavable[0x10])(this_02,pTVar5);
  TPZAutoPointer<TPZMatrixSolver<double>_>::~TPZAutoPointer
            ((TPZAutoPointer<TPZMatrixSolver<double>_> *)this_02);
  TPZAutoPointer<TPZMatrix<double>_>::~TPZAutoPointer((TPZAutoPointer<TPZMatrix<double>_> *)this_02)
  ;
  TPZAutoPointer<TPZStructMatrix>::~TPZAutoPointer((TPZAutoPointer<TPZStructMatrix> *)this_02);
  return;
}

Assistant:

void TPZSubCompMesh::SetAnalysisNonSymSparse(int numThreads)
{
    fAnalysis = new TPZSubMeshAnalysis(this);
    TPZAutoPointer<TPZStructMatrix> str = NULL;

    if(numThreads > 0){
        str = new TPZSpStructMatrix<STATE>(this);
        str->SetNumThreads(numThreads);
    }
    else{
        str = new TPZSpStructMatrix<STATE>(this);
    }

    SaddlePermute();
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
    {
        std::stringstream sout;
        Print(sout);
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
    PermuteExternalConnects();
    str->SetNumThreads(numThreads);
    int64_t numinternal = NumInternalEquations();
    str->EquationFilter().SetMinMaxEq(0, numinternal);
    TPZAutoPointer<TPZMatrix<STATE> > mat =
        dynamic_cast<TPZMatrix<STATE>*>(str->Create());
    if(!mat){
        PZError<<__PRETTY_FUNCTION__;
        PZError<<"ERROR\n: Incompatible types. Aborting...\n";
        DebugStop();
    }
    str->EquationFilter().Reset();
    fAnalysis->SetStructuralMatrix(str);
    TPZStepSolver<STATE> *step = new TPZStepSolver<STATE>(mat);
    step->SetDirect(ELDLt);
    TPZAutoPointer<TPZMatrixSolver<STATE> > autostep = step;
    fAnalysis->SetSolver(autostep);

}